

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::FboTestUtil::genTexFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,FboTestUtil *this,
          vector<glu::DataType,_std::allocator<glu::DataType>_> *samplerTypes,DataType outputType)

{
  ostream *poVar1;
  char *pcVar2;
  size_type sVar3;
  const_reference pvVar4;
  int local_1b4;
  int local_1b0;
  int inNdx;
  int samplerNdx;
  ostringstream local_1a0 [8];
  ostringstream src;
  char *precision;
  DataType outputType_local;
  vector<glu::DataType,_std::allocator<glu::DataType>_> *samplerTypes_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"#version 300 es\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out highp ");
  pcVar2 = glu::getDataTypeName((DataType)samplerTypes);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," o_color0;\n");
  std::operator<<((ostream *)local_1a0,"in highp vec2 v_coord;\n");
  local_1b0 = 0;
  while( true ) {
    sVar3 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::size
                      ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)this);
    if ((int)sVar3 <= local_1b0) break;
    poVar1 = std::operator<<((ostream *)local_1a0,"uniform ");
    poVar1 = std::operator<<(poVar1,"highp");
    poVar1 = std::operator<<(poVar1," ");
    pvVar4 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::operator[]
                       ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)this,
                        (long)local_1b0);
    pcVar2 = glu::getDataTypeName(*pvVar4);
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1," u_sampler");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<((ostream *)local_1a0,"uniform ");
    poVar1 = std::operator<<(poVar1,"highp");
    poVar1 = std::operator<<(poVar1," vec4 u_texScale");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<((ostream *)local_1a0,"uniform ");
    poVar1 = std::operator<<(poVar1,"highp");
    poVar1 = std::operator<<(poVar1," vec4 u_texBias");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    std::operator<<(poVar1,";\n");
    local_1b0 = local_1b0 + 1;
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"uniform ");
  poVar1 = std::operator<<(poVar1,"highp");
  poVar1 = std::operator<<(poVar1," vec4 u_outScale0;\n");
  poVar1 = std::operator<<(poVar1,"uniform ");
  poVar1 = std::operator<<(poVar1,"highp");
  std::operator<<(poVar1," vec4 u_outBias0;\n");
  poVar1 = std::operator<<((ostream *)local_1a0,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"highp");
  std::operator<<(poVar1," vec4 out0 = vec4(0.0);\n");
  local_1b4 = 0;
  while( true ) {
    sVar3 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::size
                      ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)this);
    if ((int)sVar3 <= local_1b4) break;
    poVar1 = std::operator<<((ostream *)local_1a0,"\tout0 += vec4(");
    poVar1 = std::operator<<(poVar1,"texture(u_sampler");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
    poVar1 = std::operator<<(poVar1,", v_coord)) * u_texScale");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
    poVar1 = std::operator<<(poVar1," + u_texBias");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
    std::operator<<(poVar1,";\n");
    local_1b4 = local_1b4 + 1;
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"\to_color0 = ");
  pcVar2 = glu::getDataTypeName((DataType)samplerTypes);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"(out0 * u_outScale0 + u_outBias0);\n");
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static string genTexFragmentShader (const vector<glu::DataType>& samplerTypes, glu::DataType outputType)
{
	const char*			precision	= "highp";
	std::ostringstream	src;

	src << "#version 300 es\n"
		<< "layout(location = 0) out highp " << glu::getDataTypeName(outputType) << " o_color0;\n";

	src << "in highp vec2 v_coord;\n";

	for (int samplerNdx = 0; samplerNdx < (int)samplerTypes.size(); samplerNdx++)
	{
		src << "uniform " << precision << " " << glu::getDataTypeName(samplerTypes[samplerNdx]) << " u_sampler" << samplerNdx << ";\n";
		src << "uniform " << precision << " vec4 u_texScale" << samplerNdx << ";\n";
		src << "uniform " << precision << " vec4 u_texBias" << samplerNdx << ";\n";
	}

	// Output scale & bias
	src << "uniform " << precision << " vec4 u_outScale0;\n"
		<< "uniform " << precision << " vec4 u_outBias0;\n";

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	" << precision << " vec4 out0 = vec4(0.0);\n";

	// Texture input fetch and combine.
	for (int inNdx = 0; inNdx < (int)samplerTypes.size(); inNdx++)
		src << "\tout0 += vec4("
			<< "texture(u_sampler" << inNdx << ", v_coord)) * u_texScale" << inNdx << " + u_texBias" << inNdx << ";\n";

	// Write output.
	src << "	o_color0 = " << glu::getDataTypeName(outputType) << "(out0 * u_outScale0 + u_outBias0);\n";

	src << "}\n";

	return src.str();
}